

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

void read_intra_block_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_reader *r)

{
  BLOCK_SIZE bsize_00;
  PREDICTION_MODE PVar1;
  UV_PREDICTION_MODE UVar2;
  uint8_t uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  AV1_COMMON *in_RCX;
  MACROBLOCKD *in_RDX;
  AV1_COMMON *in_RSI;
  long in_RDI;
  PREDICTION_MODE intra_mode;
  FRAME_CONTEXT *ec_ctx;
  int use_angle_delta;
  BLOCK_SIZE bsize;
  aom_reader *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  AV1_COMMON *in_stack_ffffffffffffffb8;
  AV1_COMMON *pAVar7;
  AV1_COMMON *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffcc;
  AV1_COMMON *ec_ctx_00;
  AV1_COMMON *pAVar8;
  
  bsize_00 = (BLOCK_SIZE)in_RDX->mi_row;
  iVar5 = av1_use_angle_delta(bsize_00);
  in_RDX->plane[0].plane_type = '\0';
  in_RDX->plane[0].field_0x1 = 0xff;
  pAVar7 = (AV1_COMMON *)(in_RSI->quant_params).gqmatrix[5][2][3];
  PVar1 = read_intra_mode((aom_reader *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (aom_cdf_prob *)in_stack_ffffffffffffffa8);
  *(PREDICTION_MODE *)((long)&in_RDX->mi_row + 2) = PVar1;
  if (iVar5 == 0) {
LAB_001e2e28:
    iVar6 = 0;
  }
  else {
    iVar6 = av1_is_directional_mode(*(PREDICTION_MODE *)((long)&in_RDX->mi_row + 2));
    if (iVar6 == 0) goto LAB_001e2e28;
    iVar6 = read_angle_delta((aom_reader *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             (aom_cdf_prob *)in_stack_ffffffffffffffa8);
  }
  *(char *)&in_RDX->plane[0].pre[0].stride = (char)iVar6;
  if ((*(char *)(*(long *)(in_RDI + 0x6088) + 0x4d) != '\0') ||
     (((in_RSI->current_frame).pyramid_level & 1) == 0)) {
    *(undefined1 *)((long)&in_RDX->mi_row + 3) = 0;
    goto LAB_001e2f55;
  }
  ec_ctx_00 = pAVar7;
  pAVar8 = in_RCX;
  is_cfl_allowed((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffcc,iVar6));
  UVar2 = read_intra_mode_uv((FRAME_CONTEXT *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffa8,'\0','\0');
  *(UV_PREDICTION_MODE *)((long)&in_RDX->mi_row + 3) = UVar2;
  in_stack_ffffffffffffffb8 = pAVar7;
  in_stack_ffffffffffffffc0 = in_RCX;
  if (*(char *)((long)&in_RDX->mi_row + 3) == '\r') {
    uVar3 = read_cfl_alphas((FRAME_CONTEXT *)ec_ctx_00,
                            (aom_reader *)CONCAT44(in_stack_ffffffffffffffcc,iVar6),(int8_t *)in_RCX
                           );
    in_RDX->plane[0].pre[0].field_0x1d = uVar3;
    in_stack_ffffffffffffffb8 = pAVar7;
    in_stack_ffffffffffffffc0 = in_RCX;
  }
  in_RCX = pAVar8;
  PVar1 = get_uv_mode(*(UV_PREDICTION_MODE *)((long)&in_RDX->mi_row + 3));
  if (iVar5 == 0) {
LAB_001e2f34:
    in_stack_ffffffffffffffb4 = 0;
  }
  else {
    iVar5 = av1_is_directional_mode(PVar1);
    if (iVar5 == 0) goto LAB_001e2f34;
    in_stack_ffffffffffffffb4 =
         read_angle_delta((aom_reader *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (aom_cdf_prob *)in_stack_ffffffffffffffa8);
  }
  *(char *)((long)&in_RDX->plane[0].pre[0].stride + 1) = (char)in_stack_ffffffffffffffb4;
LAB_001e2f55:
  bVar4 = store_cfl_required(in_stack_ffffffffffffffb8,
                             (MACROBLOCKD *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  *(uint *)((in_RSI->quant_params).gqmatrix[0xf][0] + 0x12) = (uint)bVar4;
  *(undefined1 *)((long)&in_RDX->plane[0].left_entropy_context + 6) = 0;
  *(undefined1 *)((long)&in_RDX->plane[0].left_entropy_context + 7) = 0;
  iVar5 = av1_allow_palette((uint)(*(byte *)(in_RDI + 0x1ef) & 1),bsize_00);
  if (iVar5 != 0) {
    read_palette_mode_info(in_RSI,in_RDX,(aom_reader *)in_RCX);
  }
  read_filter_intra_mode_info
            (in_stack_ffffffffffffffc0,(MACROBLOCKD *)in_stack_ffffffffffffffb8,
             (aom_reader *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

static void read_intra_block_mode_info(AV1_COMMON *const cm,
                                       MACROBLOCKD *const xd,
                                       MB_MODE_INFO *const mbmi,
                                       aom_reader *r) {
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int use_angle_delta = av1_use_angle_delta(bsize);

  mbmi->ref_frame[0] = INTRA_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;

  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;

  mbmi->mode = read_intra_mode(r, ec_ctx->y_mode_cdf[size_group_lookup[bsize]]);

  mbmi->angle_delta[PLANE_TYPE_Y] =
      use_angle_delta && av1_is_directional_mode(mbmi->mode)
          ? read_angle_delta(r, ec_ctx->angle_delta_cdf[mbmi->mode - V_PRED])
          : 0;
  if (!cm->seq_params->monochrome && xd->is_chroma_ref) {
    mbmi->uv_mode =
        read_intra_mode_uv(ec_ctx, r, is_cfl_allowed(xd), mbmi->mode);
    if (mbmi->uv_mode == UV_CFL_PRED) {
      mbmi->cfl_alpha_idx =
          read_cfl_alphas(xd->tile_ctx, r, &mbmi->cfl_alpha_signs);
    }
    const PREDICTION_MODE intra_mode = get_uv_mode(mbmi->uv_mode);
    mbmi->angle_delta[PLANE_TYPE_UV] =
        use_angle_delta && av1_is_directional_mode(intra_mode)
            ? read_angle_delta(r, ec_ctx->angle_delta_cdf[intra_mode - V_PRED])
            : 0;
  } else {
    // Avoid decoding angle_info if there is no chroma prediction
    mbmi->uv_mode = UV_DC_PRED;
  }
  xd->cfl.store_y = store_cfl_required(cm, xd);

  mbmi->palette_mode_info.palette_size[0] = 0;
  mbmi->palette_mode_info.palette_size[1] = 0;
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize))
    read_palette_mode_info(cm, xd, r);

  read_filter_intra_mode_info(cm, xd, r);
}